

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::ConstraintPrototypeSyntax::setChild
          (ConstraintPrototypeSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSVar1;
  TokenList *pTVar2;
  SyntaxNode *pSVar3;
  logic_error *this_00;
  Token TVar4;
  NameSyntax *local_148;
  string local_120;
  allocator<char> local_e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined8 local_48;
  Info *local_40;
  NameSyntax *local_38;
  NameSyntax *local_30;
  undefined8 local_28;
  Info *local_20;
  size_t local_18;
  size_t index_local;
  ConstraintPrototypeSyntax *this_local;
  
  local_18 = index;
  index_local = (size_t)this;
  switch(index) {
  case 0:
    pSVar3 = TokenOrSyntax::node(&child);
    pSVar1 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>>
                       (pSVar3);
    SyntaxList<slang::syntax::AttributeInstanceSyntax>::operator=
              (&(this->super_MemberSyntax).attributes,pSVar1);
    break;
  case 1:
    pSVar3 = TokenOrSyntax::node(&child);
    pTVar2 = SyntaxNode::as<slang::syntax::TokenList>(pSVar3);
    TokenList::operator=(&this->qualifiers,pTVar2);
    break;
  case 2:
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_28 = TVar4._0_8_;
    (this->keyword).kind = (undefined2)local_28;
    (this->keyword).field_0x2 = local_28._2_1_;
    (this->keyword).numFlags = (NumericTokenFlags)local_28._3_1_;
    (this->keyword).rawLen = local_28._4_4_;
    local_20 = TVar4.info;
    (this->keyword).info = local_20;
    break;
  case 3:
    pSVar3 = TokenOrSyntax::node(&child);
    if (pSVar3 == (SyntaxNode *)0x0) {
      local_148 = (NameSyntax *)0x0;
    }
    else {
      pSVar3 = TokenOrSyntax::node(&child);
      local_148 = SyntaxNode::as<slang::syntax::NameSyntax>(pSVar3);
    }
    local_38 = local_148;
    not_null<slang::syntax::NameSyntax*>::not_null<slang::syntax::NameSyntax*,void>
              ((not_null<slang::syntax::NameSyntax*> *)&local_30,&local_38);
    (this->name).ptr = local_30;
    break;
  case 4:
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_48 = TVar4._0_8_;
    (this->semi).kind = (undefined2)local_48;
    (this->semi).field_0x2 = local_48._2_1_;
    (this->semi).numFlags = (NumericTokenFlags)local_48._3_1_;
    (this->semi).rawLen = local_48._4_4_;
    local_40 = TVar4.info;
    (this->semi).info = local_40;
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O0/extern/slang/source/AllSyntax.cpp"
               ,&local_e9);
    std::operator+(&local_c8,&local_e8,":");
    std::__cxx11::to_string(&local_120,0xc3c);
    std::operator+(&local_a8,&local_c8,&local_120);
    std::operator+(&local_88,&local_a8,": ");
    std::operator+(&local_68,&local_88,"Default case should be unreachable!");
    std::logic_error::logic_error(this_00,(string *)&local_68);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

void ConstraintPrototypeSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: qualifiers = child.node()->as<TokenList>(); return;
        case 2: keyword = child.token(); return;
        case 3: name = child.node() ? &child.node()->as<NameSyntax>() : nullptr; return;
        case 4: semi = child.token(); return;
        default: ASSUME_UNREACHABLE;
    }
}